

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.c
# Opt level: O0

GLboolean parseGLVersion(int *api,int *major,int *minor,int *rev)

{
  int iVar1;
  size_t __n;
  size_t length;
  char *prefixes [4];
  char *local_50;
  char *version;
  int local_40;
  int _rev;
  int _minor;
  int _major;
  int _api;
  int i;
  int *rev_local;
  int *minor_local;
  int *major_local;
  int *api_local;
  
  _minor = 0x30001;
  local_40 = 0;
  version._4_4_ = 0;
  prefixes[0] = "OpenGL ES-CL ";
  prefixes[1] = "OpenGL ES ";
  prefixes[2] = (char *)0x0;
  __api = rev;
  rev_local = minor;
  minor_local = major;
  major_local = api;
  local_50 = (char *)glGetString(0x1f02);
  if (local_50 == (char *)0x0) {
    _glfwInputError(0x10008,"Failed to retrieve context version string");
    api_local._7_1_ = '\0';
  }
  else {
    _major = 0;
    while (prefixes[(long)_major + -1] != (char *)0x0) {
      __n = strlen(prefixes[(long)_major + -1]);
      iVar1 = strncmp(local_50,prefixes[(long)_major + -1],__n);
      if (iVar1 == 0) {
        local_50 = local_50 + __n;
        _minor = 0x30002;
        break;
      }
      _major = _major + 1;
    }
    iVar1 = __isoc99_sscanf(local_50,"%d.%d.%d",&_rev,&local_40,(long)&version + 4);
    if (iVar1 == 0) {
      _glfwInputError(0x10008,"No version found in context version string");
      api_local._7_1_ = '\0';
    }
    else {
      *major_local = _minor;
      *minor_local = _rev;
      *rev_local = local_40;
      *__api = version._4_4_;
      api_local._7_1_ = '\x01';
    }
  }
  return api_local._7_1_;
}

Assistant:

static GLboolean parseGLVersion(int* api, int* major, int* minor, int* rev)
{
    int i, _api = GLFW_OPENGL_API, _major, _minor = 0, _rev = 0;
    const char* version;
    const char* prefixes[] =
    {
        "OpenGL ES-CM ",
        "OpenGL ES-CL ",
        "OpenGL ES ",
        NULL
    };

    version = (const char*) glGetString(GL_VERSION);
    if (!version)
    {
        _glfwInputError(GLFW_PLATFORM_ERROR,
                        "Failed to retrieve context version string");
        return GL_FALSE;
    }

    for (i = 0;  prefixes[i];  i++)
    {
        const size_t length = strlen(prefixes[i]);

        if (strncmp(version, prefixes[i], length) == 0)
        {
            version += length;
            _api = GLFW_OPENGL_ES_API;
            break;
        }
    }

    if (!sscanf(version, "%d.%d.%d", &_major, &_minor, &_rev))
    {
        _glfwInputError(GLFW_PLATFORM_ERROR,
                        "No version found in context version string");
        return GL_FALSE;
    }

    *api = _api;
    *major = _major;
    *minor = _minor;
    *rev = _rev;

    return GL_TRUE;
}